

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

void Gia_AigerWriteUnsigned(Vec_Str_t *vStr,uint x)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)x;
  if (0x7f < x) {
    do {
      uVar4 = vStr->nSize;
      if (uVar4 == vStr->nCap) {
        if ((int)uVar4 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(0x10);
          }
          else {
            pcVar3 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar3;
          vStr->nCap = 0x10;
        }
        else {
          sVar2 = (ulong)uVar4 * 2;
          if (vStr->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(sVar2);
          }
          else {
            pcVar3 = (char *)realloc(vStr->pArray,sVar2);
          }
          vStr->pArray = pcVar3;
          vStr->nCap = (int)sVar2;
        }
      }
      else {
        pcVar3 = vStr->pArray;
      }
      uVar4 = (uint)uVar5;
      iVar1 = vStr->nSize;
      vStr->nSize = iVar1 + 1;
      pcVar3[iVar1] = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
    } while (0x3fff < uVar4);
  }
  uVar4 = vStr->nSize;
  if (uVar4 == vStr->nCap) {
    if ((int)uVar4 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = 0x10;
    }
    else {
      sVar2 = (ulong)uVar4 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar2);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,sVar2);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = (int)sVar2;
    }
  }
  else {
    pcVar3 = vStr->pArray;
  }
  iVar1 = vStr->nSize;
  vStr->nSize = iVar1 + 1;
  pcVar3[iVar1] = (char)uVar5;
  return;
}

Assistant:

static inline void Gia_AigerWriteUnsigned( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
    Vec_StrPush( vStr, ch );
}